

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9CompileString(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  byte bVar1;
  int iVar2;
  sxi32 sVar3;
  byte *pbVar4;
  ushort **ppuVar5;
  long lVar6;
  sxu32 nLen;
  byte *pbVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  char *zData;
  byte *pbVar12;
  bool bVar13;
  sxi32 iCons;
  int c_1;
  int c;
  jx9_value *local_50;
  sxi32 local_48;
  int local_44;
  jx9_gen_state *local_40;
  int local_34;
  
  pbVar8 = (byte *)(pGen->pIn->sData).zString;
  pbVar12 = pbVar8 + (pGen->pIn->sData).nByte;
  local_48 = 0;
  local_50 = (jx9_value *)0x0;
  pbVar7 = pbVar8;
  local_40 = pGen;
  pbVar11 = pbVar8;
joined_r0x0012ab70:
  do {
    while (bVar13 = pbVar7 < pbVar12, bVar13) {
      pbVar4 = pbVar7 + 1;
      pGen = local_40;
      if (*pbVar7 == 0x24) {
        if (pbVar4 < pbVar12) {
          bVar1 = *pbVar4;
          pbVar7 = pbVar8;
          if (((0xffffffffffffffbf < (ulong)(long)(char)bVar1) ||
              (ppuVar5 = __ctype_b_loc(), pGen = local_40, bVar1 == 0x5f)) ||
             (((*ppuVar5)[(char)bVar1] & 0x400) != 0)) break;
        }
      }
      else if (*pbVar7 == 0x5c) break;
      pbVar8 = pbVar8 + 1;
      pbVar7 = pbVar4;
      pGen = local_40;
    }
    if (pbVar11 < pbVar7) {
      if ((local_50 == (jx9_value *)0x0) &&
         (local_50 = GenStateNewStrObj(pGen,&local_48), local_50 == (jx9_value *)0x0)) {
        return -10;
      }
      nLen = (int)pbVar7 - (int)pbVar11;
    }
    else {
      if ((local_50 == (jx9_value *)0x0) &&
         (local_50 = GenStateNewStrObj(pGen,&local_48), local_50 == (jx9_value *)0x0)) {
        return -10;
      }
      pbVar11 = (byte *)0x14856a;
      nLen = 0;
    }
    jx9MemObjStringAppend(local_50,(char *)pbVar11,nLen);
    if (!bVar13) goto LAB_0012b12b;
    if (*pbVar7 != 0x5c) break;
    pbVar4 = pbVar7 + 1;
    pbVar8 = pbVar4;
    if (pbVar12 <= pbVar4) goto LAB_0012b07e;
    bVar1 = *pbVar4;
    if (bVar1 < 0x62) {
      if (bVar1 < 0x30) {
        if (bVar1 == 0x22) {
          zData = "\"";
        }
        else if (bVar1 == 0x24) {
          zData = "$";
        }
        else {
          if (bVar1 != 0x27) goto switchD_0012ae4b_caseD_70;
          zData = (char *)(byte *)0x147221;
        }
      }
      else if (bVar1 == 0x30) {
        zData = "";
      }
      else if (bVar1 == 0x5c) {
        zData = "\\";
      }
      else {
        if (bVar1 != 0x61) goto switchD_0012ae4b_caseD_70;
        zData = "\a";
      }
      goto LAB_0012b061;
    }
    switch(bVar1) {
    case 0x6e:
      zData = "\n";
      break;
    case 0x6f:
      if (pbVar7 + 2 < pbVar12) {
        bVar1 = pbVar7[2];
        if ((((ulong)(long)(char)bVar1 < 0xffffffffffffffc0) &&
            (ppuVar5 = __ctype_b_loc(), (char)bVar1 < '8')) &&
           (((*ppuVar5)[(char)bVar1] & 0x800) != 0)) {
          local_44 = 0;
          pbVar8 = pbVar7 + 3;
          uVar9 = 2;
          while( true ) {
            bVar1 = pbVar8[-1];
            uVar10 = uVar9;
            if (((0xffffffffffffffbf < (ulong)(long)(char)bVar1) || ('7' < (char)bVar1)) ||
               (((*ppuVar5)[(char)bVar1] & 0x800) == 0)) break;
            local_44 = (int)(char)bVar1 + local_44 * 8 + -0x30;
            uVar10 = uVar9 + 1;
            if ((3 < uVar9) ||
               (bVar13 = pbVar12 <= pbVar8, pbVar8 = pbVar8 + 1, uVar9 = uVar10, bVar13)) break;
          }
          if (0 < local_44) {
            jx9MemObjStringAppend(local_50,(char *)&local_44,1);
          }
          uVar9 = (ulong)((int)uVar10 - 2);
          lVar6 = 2;
          goto LAB_0012b075;
        }
      }
      jx9MemObjStringAppend(local_50,"o",1);
      uVar9 = 1;
      lVar6 = 1;
      goto LAB_0012b075;
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
switchD_0012ae4b_caseD_70:
      zData = (char *)pbVar4;
      break;
    case 0x72:
      zData = "\r";
      break;
    case 0x74:
      zData = "\t";
      break;
    case 0x76:
      zData = "\v";
      break;
    case 0x78:
      bVar1 = pbVar7[2];
      if ((0xffffffffffffffbf < (ulong)(long)(char)bVar1) ||
         (ppuVar5 = __ctype_b_loc(),
         (*(byte *)((long)*ppuVar5 + (long)(char)bVar1 * 2 + 1) & 0x10) == 0)) {
        zData = "x";
        break;
      }
      sVar3 = SyHexToint((int)(char)pbVar7[2]);
      iVar2 = sVar3 * 0x10;
      local_34 = iVar2;
      if (pbVar7 + 3 < pbVar12) {
        sVar3 = SyHexToint((int)(char)pbVar7[3]);
        local_34 = sVar3 + iVar2;
      }
      jx9MemObjStringAppend(local_50,(char *)&local_34,1);
      lVar6 = 1;
      uVar9 = 3;
      goto LAB_0012b075;
    default:
      if (bVar1 == 0x62) {
        zData = "\b";
      }
      else {
        if (bVar1 != 0x66) goto switchD_0012ae4b_caseD_70;
        zData = "\f";
      }
    }
LAB_0012b061:
    jx9MemObjStringAppend(local_50,zData,1);
    uVar9 = 1;
    lVar6 = 1;
LAB_0012b075:
    pbVar8 = pbVar7 + uVar9 + lVar6;
LAB_0012b07e:
    pbVar7 = pbVar8;
    pbVar11 = pbVar8;
    if (pbVar12 <= pbVar4) {
LAB_0012b12b:
      if (1 < local_48) {
        jx9VmEmitInstr(pGen->pVm,0xc,local_48,0,(void *)0x0,(sxu32 *)0x0);
        return 0;
      }
      return 0;
    }
  } while( true );
  pbVar8 = pbVar7;
  if (*pbVar7 != 0x7b) {
LAB_0012acaa:
    if ((pbVar12 <= pbVar8) || (*pbVar8 != 0x24)) {
      do {
        bVar13 = pbVar8 < pbVar12;
        if (bVar13) {
          bVar1 = *pbVar8;
          if ((ulong)(long)(char)bVar1 < 0xffffffffffffffc0) {
            ppuVar5 = __ctype_b_loc();
            if ((bVar1 == 0x5f) || (((*ppuVar5)[(char)bVar1] & 8) != 0)) {
              pbVar11 = pbVar8 + 1;
              while (pbVar8 = pbVar11, bVar13 = pbVar8 < pbVar12, bVar13) {
                bVar1 = *pbVar8;
                if ((0xffffffffffffffbf < (ulong)(long)(char)bVar1) ||
                   ((pbVar11 = pbVar8 + 1, bVar1 != 0x5f && (((*ppuVar5)[(char)bVar1] & 8) == 0))))
                break;
              }
            }
          }
        }
        bVar1 = *pbVar8;
        if (bVar1 < 0xc0) goto code_r0x0012ad43;
        pbVar8 = pbVar8 + 1;
      } while( true );
    }
    goto LAB_0012acb5;
  }
  pbVar7 = pbVar7 + 1;
  uVar9 = (ulong)(pbVar7 < pbVar12);
  pbVar8 = pbVar7;
  if (pbVar7 < pbVar12) {
    iVar2 = 1;
    do {
      if (*pbVar8 == 0x7d) {
        if (iVar2 < 2) break;
        iVar2 = iVar2 + -1;
      }
      else if (*pbVar8 == 0x7b) {
        iVar2 = iVar2 + 1;
      }
      pbVar8 = pbVar8 + 1;
      uVar9 = (ulong)(pbVar8 < pbVar12);
    } while (pbVar8 < pbVar12);
  }
  sVar3 = GenStateProcessStringExpression(pGen,(char *)pbVar7,(char *)pbVar8);
  if (sVar3 != -10) {
    if (sVar3 != -3) {
      local_48 = local_48 + 1;
    }
    pbVar8 = pbVar8 + uVar9;
  }
  local_50 = (jx9_value *)0x0;
  pbVar7 = pbVar8;
  pbVar11 = pbVar8;
  if (sVar3 == -10) {
    return -10;
  }
  goto joined_r0x0012ab70;
code_r0x0012ad43:
  if (!bVar13) goto LAB_0012aebf;
  if (bVar1 != 0x2e) goto code_r0x0012ad55;
LAB_0012acb5:
  pbVar8 = pbVar8 + 1;
  goto LAB_0012acaa;
code_r0x0012ad55:
  if (bVar1 == 0x5b) {
    pbVar11 = pbVar8 + 1;
    bVar13 = pbVar11 < pbVar12;
    if (bVar13) {
      iVar2 = 1;
      do {
        pbVar8 = pbVar11;
        if (*pbVar8 == 0x5d) {
          if (iVar2 < 2) {
            pbVar11 = pbVar8;
            pbVar8 = pbVar8 + -1;
            break;
          }
          iVar2 = iVar2 + -1;
        }
        else if (*pbVar8 == 0x5b) {
          iVar2 = iVar2 + 1;
        }
        pbVar11 = pbVar8 + 1;
        bVar13 = pbVar11 < pbVar12;
      } while (bVar13);
    }
    pbVar8 = pbVar8 + 2;
    if (!bVar13) {
      pbVar8 = pbVar11;
    }
  }
LAB_0012aebf:
  sVar3 = GenStateProcessStringExpression(pGen,(char *)pbVar7,(char *)pbVar8);
  local_50 = (jx9_value *)0x0;
  pbVar7 = pbVar8;
  pbVar11 = pbVar8;
  if (sVar3 != -3) {
    if (sVar3 == -10) {
      return -10;
    }
    local_48 = local_48 + 1;
    local_50 = (jx9_value *)0x0;
  }
  goto joined_r0x0012ab70;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileString(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	sxi32 rc;
	rc = GenStateCompileString(&(*pGen));
	SXUNUSED(iCompileFlag); /* cc warning */
	/* Compilation result */
	return rc;
}